

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addInversion(Molecule *this,Inversion *inversion)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *in_RDI;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::begin(in_RDI);
  __val = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::Inversion**,std::vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>>>,OpenMD::Inversion*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::push_back
              ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
               __last._M_current,__val._M_current);
  }
  return;
}

Assistant:

void Molecule::addInversion(Inversion* inversion) {
    if (std::find(inversions_.begin(), inversions_.end(), inversion) ==
        inversions_.end()) {
      inversions_.push_back(inversion);
    }
  }